

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwindowsysteminterface.cpp
# Opt level: O0

bool QWindowSystemHelper<QWindowSystemInterface::SynchronousDelivery>::
     handleEvent<QWindowSystemInterfacePrivate::ThemeChangeEvent>(void)

{
  long lVar1;
  ulong uVar2;
  long in_FS_OFFSET;
  ThemeChangeEvent event;
  ProcessEventsFlag in_stack_ffffffffffffffcc;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  bool local_25;
  undefined1 *local_20;
  WindowSystemEvent *e;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  uVar2 = QThread::isMainThread();
  if ((uVar2 & 1) == 0) {
    QWindowSystemHelper<QWindowSystemInterface::AsynchronousDelivery>::
    handleEvent<QWindowSystemInterfacePrivate::ThemeChangeEvent>();
    QFlags<QEventLoop::ProcessEventsFlag>::QFlags
              ((QFlags<QEventLoop::ProcessEventsFlag> *)
               CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
               in_stack_ffffffffffffffcc);
    local_25 = QWindowSystemInterface::flushWindowSystemEvents
                         ((ProcessEventsFlags)event.super_WindowSystemEvent._20_4_);
  }
  else {
    local_20 = &DAT_aaaaaaaaaaaaaaaa;
    e = (WindowSystemEvent *)&DAT_aaaaaaaaaaaaaaaa;
    QWindowSystemInterfacePrivate::ThemeChangeEvent::ThemeChangeEvent
              ((ThemeChangeEvent *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
    if (QWindowSystemInterfacePrivate::eventHandler == (QWindowSystemEventHandler *)0x0) {
      QGuiApplicationPrivate::processWindowSystemEvent(e);
    }
    else {
      (*QWindowSystemInterfacePrivate::eventHandler->_vptr_QWindowSystemEventHandler[2])
                (QWindowSystemInterfacePrivate::eventHandler,&local_20);
    }
    local_25 = false;
    QWindowSystemInterfacePrivate::ThemeChangeEvent::~ThemeChangeEvent((ThemeChangeEvent *)0x44f16f)
    ;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return local_25;
}

Assistant:

bool QWindowSystemHelper<QWindowSystemInterface::SynchronousDelivery>::handleEvent(Args ...args)
{
    if (QThread::isMainThread()) {
        EventType event(args...);
        // Process the event immediately on the Gui thread and return the accepted state
        if (QWindowSystemInterfacePrivate::eventHandler) {
            if (!QWindowSystemInterfacePrivate::eventHandler->sendEvent(&event))
                return false;
        } else {
            QGuiApplicationPrivate::processWindowSystemEvent(&event);
        }
        return event.eventAccepted;
    } else {
        // Post the event on the Qt main thread queue and flush the queue.
        // This will wake up the Gui thread which will process the event.
        // Return the accepted state for the last event on the queue,
        // which is the event posted by this function.
        QWindowSystemHelper<QWindowSystemInterface::AsynchronousDelivery>::handleEvent<EventType>(args...);
        return QWindowSystemInterface::flushWindowSystemEvents();
    }
}